

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall
helics::apps::App::loadFile(App *this,string *filename,bool enableFederateInterfaceRegistration)

{
  string_view jsonString;
  string_view tomlString;
  string_view message;
  bool bVar1;
  element_type *peVar2;
  byte in_DL;
  undefined8 in_RSI;
  Federate *in_RDI;
  undefined1 in_stack_00000038 [15];
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  jsonString._M_str._7_1_ = enableFederateInterfaceRegistration;
  jsonString._0_15_ = in_stack_00000038;
  bVar1 = fileops::hasJsonExtension(jsonString);
  if (bVar1) {
    (**(code **)(((_Alloc_hider *)&in_RDI->_vptr_Federate)->_M_p + 0x30))(in_RDI,in_RSI,in_DL & 1);
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    tomlString._M_str._7_1_ = enableFederateInterfaceRegistration;
    tomlString._0_15_ = in_stack_00000038;
    bVar1 = fileops::hasTomlExtension(tomlString);
    if (bVar1) {
      if ((in_DL & 1) == 0) {
        CLI::std::
        __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x41a514);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        message._M_str = (char *)in_stack_ffffffffffffffc0;
        message._M_len = (size_t)in_stack_ffffffffffffffb8;
        Federate::logWarningMessage(in_RDI,message);
      }
      else {
        peVar2 = CLI::std::
                 __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x41a4f6);
        (*(peVar2->super_ValueFederate)._vptr_ValueFederate[3])(peVar2,in_RSI);
      }
    }
    else {
      (**(code **)(((_Alloc_hider *)&in_RDI->_vptr_Federate)->_M_p + 0x38))(in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void App::loadFile(const std::string& filename, bool enableFederateInterfaceRegistration)
{
    if (fileops::hasJsonExtension(filename)) {
        loadJsonFile(filename, enableFederateInterfaceRegistration);
    } else if (fileops::hasTomlExtension(filename)) {
        if (enableFederateInterfaceRegistration) {
            fed->registerInterfaces(filename);
        } else {
            fed->logWarningMessage("Toml files are not support for app configuration");
        }
    } else {
        loadTextFile(filename);
    }
}